

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTransform.h
# Opt level: O2

ChVector<double> *
chrono::ChTransform<double>::TransformParentToLocal
          (ChVector<double> *parent,ChVector<double> *origin,ChQuaternion<double> *alignment)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  ChVector<double> *in_RDI;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  dVar1 = alignment->m_data[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  dVar2 = alignment->m_data[2];
  dVar3 = alignment->m_data[1];
  dVar4 = alignment->m_data[3];
  auVar14 = ZEXT816(0xbff0000000000000);
  auVar15 = ZEXT816(0x4000000000000000);
  dVar5 = parent->m_data[1] - origin->m_data[1];
  dVar6 = parent->m_data[2] - origin->m_data[2];
  dVar1 = dVar1 * dVar1;
  auVar10._8_8_ = 0x8000000000000000;
  auVar10._0_8_ = 0x8000000000000000;
  auVar11 = vxorpd_avx512vl(auVar13,auVar10);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1 + dVar2 * dVar2;
  auVar10 = vfmadd213sd_fma(auVar20,auVar15,auVar14);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1 + dVar3 * dVar3;
  auVar13 = vfmadd213sd_fma(auVar17,auVar15,auVar14);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1 + dVar4 * dVar4;
  auVar16 = vfmadd213sd_fma(auVar16,auVar15,auVar14);
  dVar12 = auVar11._0_8_;
  dVar7 = parent->m_data[0] - origin->m_data[0];
  dVar8 = dVar3 * dVar2 - dVar4 * dVar12;
  dVar1 = dVar3 * dVar2 + dVar4 * dVar12;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1 + dVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar5 * auVar10._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar7;
  auVar10 = vfmadd231sd_fma(auVar21,auVar22,auVar11);
  dVar9 = dVar2 * dVar4 - dVar3 * dVar12;
  dVar1 = dVar3 * dVar12 + dVar2 * dVar4;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (dVar8 + dVar8) * dVar5;
  auVar13 = vfmadd231sd_fma(auVar26,auVar22,auVar13);
  dVar8 = dVar2 * dVar12 + dVar3 * dVar4;
  dVar2 = dVar3 * dVar4 - dVar2 * dVar12;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar9 + dVar9;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar6;
  auVar10 = vfmadd213sd_fma(auVar14,auVar24,auVar10);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar8 + dVar8;
  auVar13 = vfmadd213sd_fma(auVar18,auVar24,auVar13);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2 + dVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar5 * (dVar1 + dVar1);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar7;
  auVar11 = vfmadd231sd_fma(auVar19,auVar23,auVar15);
  in_RDI->m_data[0] = auVar13._0_8_;
  in_RDI->m_data[1] = auVar10._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar6;
  auVar10 = vfmadd213sd_fma(auVar16,auVar25,auVar11);
  in_RDI->m_data[2] = auVar10._0_8_;
  return in_RDI;
}

Assistant:

static ChVector<Real> TransformParentToLocal(
        const ChVector<Real>& parent,        ///< point to transform, given in parent coordinates
        const ChVector<Real>& origin,        ///< origin of frame respect to parent, in parent coords,
        const ChQuaternion<Real>& alignment  ///< rotation of frame respect to parent, in parent coords.
        ) {
        // It could be simply "return alignment.RotateBack(parent-origin);"
        // but for faster execution do this:
        Real e0e0 = alignment.e0() * alignment.e0();
        Real e1e1 = alignment.e1() * alignment.e1();
        Real e2e2 = alignment.e2() * alignment.e2();
        Real e3e3 = alignment.e3() * alignment.e3();
        Real e0e1 = -alignment.e0() * alignment.e1();
        Real e0e2 = -alignment.e0() * alignment.e2();
        Real e0e3 = -alignment.e0() * alignment.e3();
        Real e1e2 = alignment.e1() * alignment.e2();
        Real e1e3 = alignment.e1() * alignment.e3();
        Real e2e3 = alignment.e2() * alignment.e3();
        Real dx = parent.x() - origin.x();
        Real dy = parent.y() - origin.y();
        Real dz = parent.z() - origin.z();
        return ChVector<Real>(((e0e0 + e1e1) * 2. - 1.) * dx + ((e1e2 - e0e3) * 2.) * dy + ((e1e3 + e0e2) * 2.) * dz,
                              ((e1e2 + e0e3) * 2.) * dx + ((e0e0 + e2e2) * 2. - 1.) * dy + ((e2e3 - e0e1) * 2.) * dz,
                              ((e1e3 - e0e2) * 2.) * dx + ((e2e3 + e0e1) * 2.) * dy + ((e0e0 + e3e3) * 2. - 1.) * dz);
    }